

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnndelem * copydelem(rnndelem *elem,char *file)

{
  int iVar1;
  rnndelem *src;
  rnndelem **pprVar2;
  rnndelem *prVar3;
  rnndelem *in_RSI;
  rnnetype *in_RDI;
  int i;
  rnndelem *res;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  
  src = (rnndelem *)calloc(0x108,1);
  src->type = *in_RDI;
  src->name = *(char **)(in_RDI + 2);
  src->width = in_RDI[4];
  src->access = in_RDI[5];
  src->offset = *(undefined8 *)(in_RDI + 6);
  src->length = *(undefined8 *)(in_RDI + 8);
  src->stride = *(undefined8 *)(in_RDI + 10);
  memcpy(&src->varinfo,in_RDI + 0x10,0x40);
  src->file = (char *)in_RSI;
  copytypeinfo((rnntypeinfo *)in_RSI,(rnntypeinfo *)src,
               (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (iVar4 = 0; iVar4 < (int)in_RDI[0xe]; iVar4 = iVar4 + 1) {
    if (src->subelemsmax <= src->subelemsnum) {
      if (src->subelemsmax == 0) {
        src->subelemsmax = 0x10;
      }
      else {
        src->subelemsmax = src->subelemsmax << 1;
      }
      pprVar2 = (rnndelem **)realloc(src->subelems,(long)src->subelemsmax << 3);
      src->subelems = pprVar2;
    }
    prVar3 = copydelem(in_RSI,(char *)src);
    iVar1 = src->subelemsnum;
    src->subelemsnum = iVar1 + 1;
    src->subelems[iVar1] = prVar3;
  }
  return src;
}

Assistant:

static struct rnndelem *copydelem (struct rnndelem *elem, char *file) {
	struct rnndelem *res = calloc (sizeof *res, 1);
	res->type = elem->type;
	res->name = elem->name;
	res->width = elem->width;
	res->access = elem->access;
	res->offset = elem->offset;
	res->length = elem->length;
	res->stride = elem->stride;
	res->varinfo = elem->varinfo;
	res->file = file;
	copytypeinfo(&res->typeinfo, &elem->typeinfo, file);
	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		ADDARRAY(res->subelems, copydelem(elem->subelems[i], file));
	return res;
}